

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

Cleanup<std::function<void_()>_> *
fork_torture::setup_fork_testing
          (Cleanup<std::function<void_()>_> *__return_storage_ptr__,int *argc,char ***argv)

{
  int iVar1;
  code *pcVar2;
  undefined8 *puVar3;
  long *plVar4;
  code *pcVar5;
  undefined8 uVar6;
  char *pcVar7;
  bool bVar8;
  _union_1457 _Stack_e8;
  cpu_set_t mask;
  long *local_50 [2];
  long local_40 [2];
  
  bVar8 = true;
  if (1 < *argc) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"--with-fork-torture","");
    iVar1 = std::__cxx11::string::compare((char *)local_50);
    bVar8 = iVar1 != 0;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  if (bVar8) {
    puts("Not enabling fork torture");
    pcVar2 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:2137:52)>
             ::_M_manager;
    pcVar5 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:2137:52)>
             ::_M_invoke;
LAB_00115154:
    *(undefined8 *)&(__return_storage_ptr__->callback_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->callback_).super__Function_base._M_functor + 8)
         = 0;
    (__return_storage_ptr__->callback_)._M_invoker = pcVar5;
    (__return_storage_ptr__->callback_).super__Function_base._M_manager = pcVar2;
    return __return_storage_ptr__;
  }
  puts("Enabling fork torturing!!!!");
  iVar1 = sem_init((sem_t *)single_step_req,0,0);
  if (iVar1 == 0) {
    iVar1 = sem_init((sem_t *)single_step_ack,0,0);
    if (iVar1 == 0) {
      mask.__bits[0] = 0;
      mask.__bits[0xd] = 0;
      mask.__bits[0xe] = 0;
      mask.__bits[0xb] = 0;
      mask.__bits[0xc] = 0;
      mask.__bits[9] = 0;
      mask.__bits[10] = 0;
      mask.__bits[7] = 0;
      mask.__bits[8] = 0;
      mask.__bits[5] = 0;
      mask.__bits[6] = 0;
      mask.__bits[3] = 0;
      mask.__bits[4] = 0;
      mask.__bits[1] = 0;
      mask.__bits[2] = 0;
      _Stack_e8 = (_union_1457)0x1;
      iVar1 = sched_setaffinity(0,0x80,(cpu_set_t *)&_Stack_e8);
      if (iVar1 != 0) {
        pcVar7 = "Check failed: sched_setaffinity(0, sizeof(mask), &mask) == 0\n";
        uVar6 = 0x3d;
        goto LAB_001151ad;
      }
      memset(&_Stack_e8,0,0x98);
      _Stack_e8.sa_handler = step_handler;
      iVar1 = sigaction(5,(sigaction *)&_Stack_e8,(sigaction *)0x0);
      if (iVar1 == 0) {
        puVar3 = (undefined8 *)operator_new(8);
        *puVar3 = 0;
        _Stack_e8.sa_handler = (__sighandler_t)operator_new(0x10);
        *(undefined ***)_Stack_e8.sa_handler = &PTR___State_001628c0;
        std::thread::_M_start_thread(puVar3,&_Stack_e8,0);
        if (_Stack_e8.sa_handler != (__sighandler_t)0x0) {
          (**(code **)(*(long *)_Stack_e8.sa_handler + 8))();
        }
        xsem_wait((sem_t *)single_step_ack);
        plVar4 = (long *)MallocExtension::instance();
        (**(code **)(*plVar4 + 0x68))(plVar4);
        raise(5);
        running_fork_testing = 1;
        pcVar2 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:2230:50)>
                 ::_M_manager;
        pcVar5 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:2230:50)>
                 ::_M_invoke;
        goto LAB_00115154;
      }
      pcVar7 = "Check failed: sigaction(SIGTRAP, &sa, nullptr) == 0\n";
    }
    else {
      pcVar7 = "Check failed: sem_init(&single_step_ack, 0, 0) == 0\n";
    }
  }
  else {
    pcVar7 = "Check failed: sem_init(&single_step_req, 0, 0) == 0\n";
  }
  uVar6 = 0x34;
LAB_001151ad:
  syscall(1,2,pcVar7,uVar6);
  abort();
}

Assistant:

tcmalloc::Cleanup<std::function<void()>> setup_fork_testing(int* argc, char *** argv) {
  if (*argc < 2 || (*argv)[1] != std::string("--with-fork-torture")) {
    printf("Not enabling fork torture\n");
    return tcmalloc::Cleanup(std::function<void()>([] () {}));
  }
  printf("Enabling fork torturing!!!!\n");

  CHECK(sem_init(&single_step_req, 0, 0) == 0);
  CHECK(sem_init(&single_step_ack, 0, 0) == 0);

  // First, we set cpu affinity mask to only core 0. It helps
  // performance, but mostly it is required so that main thread never
  // runs when real-time helper thread is runnable.
  {
    cpu_set_t mask;
    memset(&mask, 0, sizeof(mask));
    CPU_SET(0, &mask);
    CHECK(sched_setaffinity(0, sizeof(mask), &mask) == 0);
  }

  // Then we prepare SIGTRAP signal handler.
  {
    struct sigaction sa;
    memset(&sa, 0, sizeof(sa));
    sa.sa_sigaction = step_handler;
    sa.sa_flags = SA_RESTART | SA_SIGINFO;
    CHECK(sigaction(SIGTRAP, &sa, nullptr) == 0);
  }

  std::thread* t = new std::thread([] () {
    // Helper thread first makes itself real-time.
    struct sched_param p;
    memset(&p, 0, sizeof(p));
    p.sched_priority = 1;
    CHECK(sched_setscheduler(0, SCHED_FIFO, &p) == 0);

    // And then signals its readiness.
    sem_post(&single_step_ack);

    MallocExtension::instance()->MarkThreadIdle();

    constexpr int kPeriod = 1 << 10;
    int cnt = kPeriod;

    while (true) {
      xsem_wait(&single_step_req);
      // Lets print something every few iterations to help us see if
      // progress is being made.
      if (--cnt <= 0) {
        write(2, "$", 1);
        cnt = kPeriod;
      }

      // Once we're about to fork, we need to flag "in_fork" mode and
      // unblock main thread.
      in_fork = true;
      sem_post(&single_step_ack);

      int child = fork();
      CHECK(child >= 0);
      if (child == 0) {
        // Child runs some mallocs and exits.
        (::operator delete)((::operator new)(32));
        (::operator delete)((::operator new)(1024));
        (::operator delete)((::operator new)(2 << 20));
        _exit(0);
      }

      // Parent asserts that child exited cleanly.
      int status = 0;
      int ret = waitpid(child, &status, 0);
      CHECK(ret == child);
      CHECK(status == 0);

      // And we un-mark in_fork mode, so that main thread continues to
      // cooperation via sem_{post/wait} on single_step_{req,ack}
      // semaphores.
      num_forks++;
      in_fork = false;
    }
  });
  (void)t; // leak
  xsem_wait(&single_step_ack);

  MallocExtension::instance()->MarkThreadIdle();

  // First SIGTRAP runs the signal handler and signal handler sets up
  // EFLAGS to single-step.
  raise(SIGTRAP);

  // This is a flag for a test that is not compatible with
  // single-stepping. NewHandler test doesn't work because it enables
  // oom simulation at some point which, naturally, crashes the forked
  // child.
  running_fork_testing = true;

  return tcmalloc::Cleanup(std::function<void()>([] () {
    stepping_stop_requested = true;
    while (!*const_cast<volatile bool*>(&stepping_stop_acked)) {
      // no-op
    }
    // In the clean up, we're ensuring that in_fork turns to false, so
    // that fork/waitpid isn't stuck.
    printf("Done with fork torturing! Number of forks performed: %lld\n", (long long)num_forks);
  }));
}